

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_util.cc
# Opt level: O1

bool bssl::IPAddressMatchesWithNetmask(Input addr1,Input addr2,Input mask)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = addr1.data_.size_;
  if (uVar1 == mask.data_.size_ && uVar1 == addr2.data_.size_) {
    bVar3 = uVar1 == 0;
    if (!bVar3) {
      uVar2 = 1;
      do {
        if ((uVar2 - mask.data_.size_ == 1) || (uVar2 - addr2.data_.size_ == 1)) {
          abort();
        }
        if ((mask.data_.data_[uVar2 - 1] &
            (addr2.data_.data_[uVar2 - 1] ^ addr1.data_.data_[uVar2 - 1])) != 0) {
          return bVar3;
        }
        bVar3 = uVar1 <= uVar2;
        bVar4 = uVar2 != uVar1;
        uVar2 = uVar2 + 1;
      } while (bVar4);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool IPAddressMatchesWithNetmask(der::Input addr1, der::Input addr2,
                                 der::Input mask) {
  if (addr1.size() != addr2.size() || addr1.size() != mask.size()) {
    return false;
  }
  for (size_t i = 0; i < addr1.size(); i++) {
    if ((addr1[i] & mask[i]) != (addr2[i] & mask[i])) {
      return false;
    }
  }
  return true;
}